

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.h
# Opt level: O2

iterator __thiscall
fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
operator()(printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
           *this,char *value)

{
  size_t in_RCX;
  void *in_RDX;
  
  if (value == (char *)0x0) {
    if ((((this->
          super_arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
          ).specs_)->super_core_format_specs).type == 'p') {
      write_null_pointer(this,'\0');
    }
    else {
      internal::
      arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::write
                (&this->
                  super_arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
                 ,0x19b65a,in_RDX,in_RCX);
    }
  }
  else {
    internal::
    arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
    operator()(&this->
                super_arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
               ,value);
  }
  return (iterator)
         (this->
         super_arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
         ).writer_.out_.container;
}

Assistant:

iterator operator()(const char *value) {
    if (value)
      base::operator()(value);
    else if (this->spec()->type == 'p')
      write_null_pointer(char_type());
    else
      this->write("(null)");
    return this->out();
  }